

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

Struct * __thiscall
spvtools::opt::InstrumentPass::GetStruct
          (InstrumentPass *this,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *fields)

{
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Struct s;
  Struct local_80;
  
  analysis::Struct::Struct(&local_80,fields);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&local_80.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x1b])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x1b])(pTVar2);
      analysis::Struct::~Struct(&local_80);
      return (Struct *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x18a,
                "analysis::Struct *spvtools::opt::InstrumentPass::GetStruct(const std::vector<const analysis::Type *> &)"
               );
}

Assistant:

analysis::Struct* InstrumentPass::GetStruct(
    const std::vector<const analysis::Type*>& fields) {
  analysis::Struct s(fields);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&s);
  assert(type && type->AsStruct());
  return type->AsStruct();
}